

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

int __thiscall JetHead::Directory::open(Directory *this,char *__file,int __oflag,...)

{
  Path *pPVar1;
  char *pcVar2;
  int iVar3;
  DIR *pDVar4;
  bool bVar5;
  int iVar6;
  dirent *__s;
  ulong uVar7;
  dirent *dir_ptr;
  dirent dir;
  dirent *local_150;
  dirent local_148;
  
  if (this->mDirHandle == (void *)0x0) {
    pDVar4 = opendir(*(char **)__file);
    this->mDirHandle = pDVar4;
    if ((this->mData).mAllocated < 0x32) {
      vector<JetHead::Path>::sizeup(&this->mData,0x32);
    }
    local_150 = &local_148;
    iVar3 = readdir_r((DIR *)this->mDirHandle,local_150,&local_150);
    uVar7 = 0;
    iVar6 = 0;
    if (iVar3 == 0) {
      do {
        __s = local_150;
        if (local_150 != (dirent *)0x0) {
          __s = (dirent *)local_150->d_name;
          pPVar1 = (this->mData).mData;
          pcVar2 = (char *)pPVar1[uVar7].mPath._M_string_length;
          strlen((char *)__s);
          std::__cxx11::string::_M_replace((ulong)(pPVar1 + uVar7),0,pcVar2,(ulong)__s);
          uVar7 = (ulong)((int)uVar7 + 1);
        }
        bVar5 = 0x31 < (int)uVar7 || local_150 == (dirent *)0x0;
        iVar6 = (int)CONCAT71((int7)((ulong)__s >> 8),bVar5);
        if (bVar5) {
          if (local_150 != (dirent *)0x0) {
            return iVar6;
          }
          this->mNumberEntries = (int)uVar7 + 1;
          return iVar6;
        }
        iVar3 = readdir_r((DIR *)this->mDirHandle,&local_148,&local_150);
      } while (iVar3 == 0);
    }
  }
  else {
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

bool Directory::open( const Path &p )
{
	if ( mDirHandle != NULL )
		return false;

	mDirHandle = opendir( p.getString().c_str() );

	mData.reserve( gNumberEntries );

	struct dirent dir;
	struct dirent *dir_ptr = &dir;
	int i = 0;

	// fill with the first gNumberEntries files.  This is done to keep this
	//  from taking too much time if the directory has 1000's of files.
	while ( dir_ptr != NULL && i < gNumberEntries )
	{
		if ( readdir_r( DIR_HANDLE, &dir, &dir_ptr ) != 0 )
			return false;

		if ( dir_ptr != NULL )
		{
			mData[ i ] = dir_ptr->d_name;
			i += 1;
		}
	}

	if ( dir_ptr == NULL )
		mNumberEntries = i + 1;

	return true;
}